

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

ssh_key * opensshcert_new_priv_openssh(ssh_keyalg *self,BinarySource *src)

{
  ptrlen *ppVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  size_t sVar7;
  opensshcert_key *poVar8;
  _Bool _Var9;
  strbuf *psVar10;
  ulong uVar11;
  ulong uVar12;
  ssh_key *psVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  bool bVar18;
  bool bVar19;
  ptrlen pl;
  ptrlen pVar20;
  ptrlen pl1;
  ptrlen pl1_00;
  strbuf *basepub;
  BinarySource pubsrc [1];
  BinarySource osshsrc [1];
  void *local_e0;
  ulong local_c8;
  strbuf *local_b0;
  opensshcert_key *local_a8;
  strbuf *local_a0;
  ssh_keyalg *local_98;
  BinarySource *local_90;
  BinarySource local_88;
  BinarySource local_58;
  
  plVar3 = (long *)self->extra;
  local_90 = src;
  pVar20 = BinarySource_get_string(src->binarysource_);
  local_a8 = opensshcert_new_shared(self,pVar20,&local_b0);
  if (local_a8 != (opensshcert_key *)0x0) {
    local_98 = self;
    psVar10 = strbuf_new();
    local_88.data = local_b0->u;
    local_88.len = local_b0->len;
    local_88.binarysource_ = &local_88;
    local_88.pos = 0;
    local_88.err = BSE_NO_ERROR;
    BinarySource_get_string(local_88.binarysource_);
    lVar4 = *plVar3;
    uVar5 = plVar3[1];
    bVar18 = uVar5 == 0;
    if (bVar18) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      uVar11 = 0;
      do {
        uVar12 = (ulong)(*(int *)(lVar4 + uVar11 * 4) + 1);
        if (uVar12 < uVar16) {
          uVar12 = uVar16;
        }
        uVar16 = uVar12;
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
    local_a0 = psVar10;
    if (uVar16 == 0) {
      local_e0 = (void *)0x0;
      local_c8 = 0;
    }
    else {
      local_e0 = saferealloc((void *)0x0,uVar16,0x10);
      memset(local_e0,0,uVar16 << 4);
      local_c8 = uVar16;
    }
    if (uVar5 != 0) {
      bVar18 = false;
      uVar11 = 1;
      do {
        uVar2 = *(uint *)(lVar4 + -4 + uVar11 * 4);
        pVar20 = BinarySource_get_string(local_88.binarysource_);
        lVar15 = (ulong)uVar2 * 0x10;
        ppVar1 = (ptrlen *)((long)local_e0 + lVar15);
        pvVar6 = *(void **)((long)local_e0 + lVar15);
        if ((pvVar6 != (void *)0x0) &&
           (pl1.len = ppVar1->len, pl1.ptr = pvVar6, _Var9 = ptrlen_eq_ptrlen(pl1,pVar20), !_Var9))
        break;
        *ppVar1 = pVar20;
        bVar18 = uVar5 <= uVar11;
        bVar19 = uVar11 != uVar5;
        uVar11 = uVar11 + 1;
      } while (bVar19);
    }
    psVar10 = local_a0;
    if (bVar18) {
      lVar4 = plVar3[4];
      uVar5 = plVar3[5];
      bVar18 = uVar5 == 0;
      uVar11 = local_c8;
      if (!bVar18) {
        uVar12 = 0;
        do {
          uVar14 = (ulong)(*(int *)(lVar4 + uVar12 * 4) + 1);
          if (uVar14 < uVar11) {
            uVar14 = uVar11;
          }
          uVar11 = uVar14;
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
      if (local_c8 < uVar11) {
        local_e0 = saferealloc(local_e0,uVar11,0x10);
        memset((void *)(uVar16 * 0x10 + (long)local_e0),0,(uVar11 - uVar16) * 0x10);
        local_c8 = uVar11;
      }
      if (uVar5 != 0) {
        bVar18 = false;
        uVar16 = 1;
        do {
          uVar2 = *(uint *)(lVar4 + -4 + uVar16 * 4);
          pVar20 = BinarySource_get_string(local_90->binarysource_);
          lVar15 = (ulong)uVar2 * 0x10;
          ppVar1 = (ptrlen *)((long)local_e0 + lVar15);
          pvVar6 = *(void **)((long)local_e0 + lVar15);
          if ((pvVar6 != (void *)0x0) &&
             (pl1_00.len = ppVar1->len, pl1_00.ptr = pvVar6, _Var9 = ptrlen_eq_ptrlen(pl1_00,pVar20)
             , !_Var9)) break;
          *ppVar1 = pVar20;
          bVar18 = uVar5 <= uVar16;
          bVar19 = uVar16 != uVar5;
          uVar16 = uVar16 + 1;
        } while (bVar19);
      }
      psVar10 = local_a0;
      uVar5 = plVar3[3];
      if (uVar5 != 0) {
        lVar4 = plVar3[2];
        uVar16 = 0;
        do {
          if (local_c8 == uVar16) {
LAB_0015f887:
            __assert_fail("i < bt->nparts",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                          ,0xb5,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
          }
          lVar15 = (ulong)*(uint *)(lVar4 + uVar16 * 4) * 0x10;
          pvVar6 = *(void **)((long)local_e0 + lVar15);
          if (pvVar6 == (void *)0x0) {
LAB_0015f8a6:
            __assert_fail("part.ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                          ,0xb7,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
          }
          pl.len = *(size_t *)((long)local_e0 + lVar15 + 8);
          pl.ptr = pvVar6;
          BinarySink_put_stringpl(psVar10->binarysink_[0].binarysink_,pl);
          uVar16 = uVar16 + 1;
        } while (uVar5 != uVar16);
      }
      safefree(local_e0);
      if (bVar18) {
        strbuf_free(local_b0);
        local_58.data = psVar10->u;
        local_58.len = psVar10->len;
        local_58.binarysource_ = &local_58;
        local_58.pos = 0;
        local_58.err = BSE_NO_ERROR;
        psVar13 = (*local_98->base_alg->new_priv_openssh)(local_98->base_alg,local_58.binarysource_)
        ;
        poVar8 = local_a8;
        local_a8->basekey = psVar13;
        strbuf_free(psVar10);
        psVar13 = &poVar8->sshk;
        if (poVar8->basekey == (ssh_key *)0x0) {
          (*psVar13->vt->freekey)(psVar13);
          return (ssh_key *)0x0;
        }
        return psVar13;
      }
    }
    else {
      sVar7 = plVar3[3];
      if (sVar7 != 0) {
        lVar4 = plVar3[2];
        sVar17 = 0;
        do {
          if (uVar16 == sVar17) goto LAB_0015f887;
          lVar15 = (ulong)*(uint *)(lVar4 + sVar17 * 4) * 0x10;
          pvVar6 = *(void **)((long)local_e0 + lVar15);
          if (pvVar6 == (void *)0x0) goto LAB_0015f8a6;
          pVar20.len = *(size_t *)((long)local_e0 + lVar15 + 8);
          pVar20.ptr = pvVar6;
          BinarySink_put_stringpl(psVar10->binarysink_[0].binarysink_,pVar20);
          sVar17 = sVar17 + 1;
        } while (sVar7 != sVar17);
      }
      safefree(local_e0);
    }
    (*((local_a8->sshk).vt)->freekey)(&local_a8->sshk);
    strbuf_free(local_b0);
    strbuf_free(psVar10);
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *opensshcert_new_priv_openssh(
    const ssh_keyalg *self, BinarySource *src)
{
    const opensshcert_extra *extra = self->extra;

    ptrlen cert = get_string(src);

    strbuf *basepub;
    opensshcert_key *ck = opensshcert_new_shared(self, cert, &basepub);
    if (!ck)
        return NULL;

    strbuf *baseossh = strbuf_new();

    /* Make the base OpenSSH key blob out of the public key blob
     * returned from opensshcert_new_shared, and the trailing
     * private data following the certificate */
    BLOBTRANS_DECLARE(bt);

    BinarySource pubsrc[1];
    BinarySource_BARE_INIT_PL(pubsrc, ptrlen_from_strbuf(basepub));
    get_string(pubsrc);            /* skip key type id */

    /* blobtrans_read might fail in this case, because we're reading
     * from two sources and they might fail to match */
    bool success = blobtrans_read(bt, pubsrc, extra->pub_fmt) &&
        blobtrans_read(bt, src, extra->cert_ossh_fmt);

    blobtrans_write(bt, BinarySink_UPCAST(baseossh), extra->base_ossh_fmt);
    blobtrans_clear(bt);

    if (!success) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        strbuf_free(baseossh);
        return NULL;
    }

    strbuf_free(basepub);

    BinarySource osshsrc[1];
    BinarySource_BARE_INIT_PL(osshsrc, ptrlen_from_strbuf(baseossh));
    ck->basekey = ssh_key_new_priv_openssh(self->base_alg, osshsrc);
    strbuf_free(baseossh);

    if (!ck->basekey) {
        ssh_key_free(&ck->sshk);
        return NULL;
    }

    return &ck->sshk;
}